

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

Parser * __thiscall c4::yml::Parser::operator=(Parser *this,Parser *that)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  bool bVar5;
  Parser *pPVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  byte bVar13;
  char msg [76];
  char local_68 [24];
  char *pcStack_50;
  undefined8 local_48;
  undefined4 local_20;
  
  bVar13 = 0;
  _free(this);
  (this->m_options).flags = (that->m_options).flags;
  sVar7 = (that->m_file).len;
  (this->m_file).str = (that->m_file).str;
  (this->m_file).len = sVar7;
  sVar7 = (that->m_buf).len;
  (this->m_buf).str = (that->m_buf).str;
  (this->m_buf).len = sVar7;
  this->m_root_id = that->m_root_id;
  this->m_tree = that->m_tree;
  detail::stack<c4::yml::Parser::State,_16UL>::operator=(&this->m_stack,&that->m_stack);
  sVar7 = (this->m_stack).m_size;
  if (sVar7 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        pPVar6 = (Parser *)(*pcVar1)();
        return pPVar6;
      }
    }
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\\';
    local_68[9] = '\\';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar7 = (this->m_stack).m_size;
  }
  this->m_state = (this->m_stack).m_stack + (sVar7 - 1);
  sVar7 = that->m_key_tag2_indentation;
  this->m_key_tag_indentation = that->m_key_tag_indentation;
  this->m_key_tag2_indentation = sVar7;
  sVar7 = (that->m_key_tag).len;
  (this->m_key_tag).str = (that->m_key_tag).str;
  (this->m_key_tag).len = sVar7;
  sVar7 = (that->m_key_tag2).len;
  (this->m_key_tag2).str = (that->m_key_tag2).str;
  (this->m_key_tag2).len = sVar7;
  this->m_val_tag_indentation = that->m_val_tag_indentation;
  sVar7 = (that->m_val_tag).len;
  (this->m_val_tag).str = (that->m_val_tag).str;
  (this->m_val_tag).len = sVar7;
  this->m_key_anchor_was_before = that->m_key_anchor_was_before;
  this->m_key_anchor_indentation = that->m_key_anchor_indentation;
  sVar7 = (that->m_key_anchor).len;
  (this->m_key_anchor).str = (that->m_key_anchor).str;
  (this->m_key_anchor).len = sVar7;
  this->m_val_anchor_indentation = that->m_val_anchor_indentation;
  sVar7 = (that->m_val_anchor).len;
  (this->m_val_anchor).str = (that->m_val_anchor).str;
  (this->m_val_anchor).len = sVar7;
  sVar7 = (that->m_filter_arena).len;
  if (sVar7 != 0) {
    _resize_filter_arena(this,sVar7);
  }
  uVar10 = that->m_newline_offsets_capacity;
  uVar8 = this->m_newline_offsets_capacity;
  if (uVar8 < uVar10) {
    _resize_locations(this,uVar10);
    uVar8 = this->m_newline_offsets_capacity;
    uVar10 = that->m_newline_offsets_capacity;
  }
  if (uVar8 < uVar10) {
    pcVar11 = "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_capacity";
    pcVar12 = local_68;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
      pcVar11 = pcVar11 + ((ulong)bVar13 * -2 + 1) * 8;
      pcVar12 = pcVar12 + ((ulong)bVar13 * -2 + 1) * 8;
    }
    local_20 = 0x797469;
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        pPVar6 = (Parser *)(*pcVar1)();
        return pPVar6;
      }
    }
    auVar3 = ZEXT1224(ZEXT412(0x6b36) << 0x40);
    LVar2.name.str._0_4_ = 0x1f7eca;
    LVar2.super_LineCol.offset = auVar3._0_8_;
    LVar2.super_LineCol.line = auVar3._8_8_;
    LVar2.super_LineCol.col = auVar3._16_8_;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x4c,LVar2,(this->m_stack).m_callbacks.m_user_data);
    uVar8 = this->m_newline_offsets_capacity;
  }
  uVar10 = that->m_newline_offsets_size;
  if (uVar8 < uVar10) {
    pcVar11 = "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_size";
    pcVar12 = local_68;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
      pcVar11 = pcVar11 + ((ulong)bVar13 * -2 + 1) * 8;
      pcVar12 = pcVar12 + ((ulong)bVar13 * -2 + 1) * 8;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        pPVar6 = (Parser *)(*pcVar1)();
        return pPVar6;
      }
    }
    auVar3 = ZEXT1224(ZEXT412(0x6b37) << 0x40);
    LVar4.name.str._0_4_ = 0x1f7eca;
    LVar4.super_LineCol.offset = auVar3._0_8_;
    LVar4.super_LineCol.line = auVar3._8_8_;
    LVar4.super_LineCol.col = auVar3._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x48,LVar4,(this->m_stack).m_callbacks.m_user_data);
    uVar10 = that->m_newline_offsets_size;
  }
  memcpy(this->m_newline_offsets,that->m_newline_offsets,uVar10 << 3);
  this->m_newline_offsets_size = that->m_newline_offsets_size;
  sVar7 = (that->m_newline_offsets_buf).len;
  (this->m_newline_offsets_buf).str = (that->m_newline_offsets_buf).str;
  (this->m_newline_offsets_buf).len = sVar7;
  return this;
}

Assistant:

Parser& Parser::operator=(Parser const& that)
{
    _free();
    m_options = (that.m_options);
    m_file = (that.m_file);
    m_buf = (that.m_buf);
    m_root_id = (that.m_root_id);
    m_tree = (that.m_tree);
    m_stack = that.m_stack;
    m_state = &m_stack.top();
    m_key_tag_indentation = (that.m_key_tag_indentation);
    m_key_tag2_indentation = (that.m_key_tag2_indentation);
    m_key_tag = (that.m_key_tag);
    m_key_tag2 = (that.m_key_tag2);
    m_val_tag_indentation = (that.m_val_tag_indentation);
    m_val_tag = (that.m_val_tag);
    m_key_anchor_was_before = (that.m_key_anchor_was_before);
    m_key_anchor_indentation = (that.m_key_anchor_indentation);
    m_key_anchor = (that.m_key_anchor);
    m_val_anchor_indentation = (that.m_val_anchor_indentation);
    m_val_anchor = (that.m_val_anchor);
    if(that.m_filter_arena.len > 0)
        _resize_filter_arena(that.m_filter_arena.len);
    if(that.m_newline_offsets_capacity > m_newline_offsets_capacity)
        _resize_locations(that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_size);
    memcpy(m_newline_offsets, that.m_newline_offsets, that.m_newline_offsets_size * sizeof(size_t));
    m_newline_offsets_size = that.m_newline_offsets_size;
    m_newline_offsets_buf = that.m_newline_offsets_buf;
    return *this;
}